

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O2

void __thiscall cppcms::widgets::password::password(password *this)

{
  allocator local_31;
  string local_30;
  
  base_widget::base_widget((base_widget *)&(this->super_text).super_base_html_input.field_0x98);
  std::__cxx11::string::string((string *)&local_30,"password",&local_31);
  text::text(&this->super_text,&PTR_construction_vtable_24__002b4c80,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  (this->super_text).super_base_html_input._vptr_base_html_input = (_func_int **)0x2b4b68;
  *(undefined8 *)&(this->super_text).super_base_html_input.field_0x98 = 0x2b4c28;
  *(undefined8 *)&(this->super_text).super_base_html_input.field_0x30 = 0x2b4bb0;
  *(undefined8 *)&(this->super_text).super_base_html_input.field_0x88 = 0;
  *(undefined8 *)&(this->super_text).super_base_html_input.field_0x90 = 0;
  return;
}

Assistant:

password::password() : text("password"), password_to_check_(0)
{
}